

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem
          (QAbstractGraphicsShapeItem *this,QGraphicsItem *parent)

{
  QAbstractGraphicsShapeItemPrivate *this_00;
  
  this_00 = (QAbstractGraphicsShapeItemPrivate *)operator_new(0x1a8);
  QAbstractGraphicsShapeItemPrivate::QAbstractGraphicsShapeItemPrivate(this_00);
  QGraphicsItem::QGraphicsItem(&this->super_QGraphicsItem,(QGraphicsItemPrivate *)this_00,parent);
  (this->super_QGraphicsItem)._vptr_QGraphicsItem = (_func_int **)&PTR__QGraphicsPixmapItem_007eb720
  ;
  return;
}

Assistant:

QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(QGraphicsItem *parent)
    : QGraphicsItem(*new QAbstractGraphicsShapeItemPrivate, parent)
{
}